

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O0

int __thiscall
sockpp::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  socket_t __fd_00;
  int s;
  error_code *err;
  int *piVar2;
  undefined4 in_register_00000034;
  socklen_t *local_a0;
  undefined4 local_88;
  sockaddr *local_80;
  stream_socket local_58;
  undefined1 local_48 [8];
  result<int> res;
  socklen_t len;
  sockaddr *p;
  sock_address *clientAddr_local;
  acceptor *this_local;
  
  if (__addr == (sockaddr *)0x0) {
    local_80 = (sockaddr *)0x0;
    local_88 = 0;
  }
  else {
    local_80 = (sockaddr *)(**(code **)(*(long *)__addr + 0x18))();
    local_88 = (**(code **)(*(long *)__addr + 0x10))();
  }
  res.err_._M_cat._4_4_ = local_88;
  __fd_00 = socket::handle((socket *)CONCAT44(in_register_00000034,__fd));
  if (__addr == (sockaddr *)0x0) {
    local_a0 = (socklen_t *)0x0;
  }
  else {
    local_a0 = (socklen_t *)((long)&res.err_._M_cat + 4);
  }
  s = ::accept(__fd_00,local_80,local_a0);
  socket::check_socket((result<int> *)local_48,s);
  bVar1 = sockpp::result::operator_cast_to_bool((result *)local_48);
  if (bVar1) {
    piVar2 = result<int>::value((result<int> *)local_48);
    stream_socket::stream_socket(&local_58,*piVar2);
    result<sockpp::stream_socket>::result((result<sockpp::stream_socket> *)this,&local_58);
    stream_socket::~stream_socket(&local_58);
  }
  else {
    err = result<int>::error((result<int> *)local_48);
    result<sockpp::stream_socket>::result((result<sockpp::stream_socket> *)this,err);
  }
  return (int)this;
}

Assistant:

result<stream_socket> acceptor::accept(sock_address* clientAddr /*=nullptr*/) noexcept {
    sockaddr* p = clientAddr ? clientAddr->sockaddr_ptr() : nullptr;
    socklen_t len = clientAddr ? clientAddr->size() : 0;

    if (auto res = check_socket(::accept(handle(), p, clientAddr ? &len : nullptr)); !res)
        return res.error();
    else
        return stream_socket{res.value()};
}